

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

bool baryonyx::itm::stop_iterating<baryonyx::itm::maximize_tag,float>
               (float value,random_engine *rng)

{
  bernoulli_distribution local_20;
  bernoulli_distribution d;
  random_engine *rng_local;
  float value_local;
  
  if ((value != 0.0) || (NAN(value))) {
    rng_local._7_1_ = value < 0.0;
  }
  else {
    d._M_param._M_p = (param_type)(param_type)rng;
    std::bernoulli_distribution::bernoulli_distribution(&local_20,0.5);
    rng_local._7_1_ =
         std::bernoulli_distribution::operator()
                   (&local_20,
                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                    d._M_param._M_p);
  }
  return rng_local._7_1_;
}

Assistant:

inline bool
stop_iterating(Float value, random_engine& rng) noexcept
{
    if (value == 0) {
        std::bernoulli_distribution d(0.5);
        return d(rng);
    }

    if constexpr (std::is_same_v<Mode, minimize_tag>)
        return value > 0;
    else
        return value < 0;
}